

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

CallInstr * __thiscall
flow::IRBuilder::
insert<flow::CallInstr,flow::IRBuiltinFunction*&,std::vector<flow::Value*,std::allocator<flow::Value*>>const&,std::__cxx11::string>
          (IRBuilder *this,IRBuiltinFunction **args,
          vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Instr *pIVar1;
  unique_ptr<flow::CallInstr,_std::default_delete<flow::CallInstr>_> local_38;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *args_local_1;
  IRBuiltinFunction **args_local;
  IRBuilder *this_local;
  
  local_28 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)args;
  args_local = (IRBuiltinFunction **)this;
  std::
  make_unique<flow::CallInstr,flow::IRBuiltinFunction*,std::vector<flow::Value*,std::allocator<flow::Value*>>const,std::__cxx11::string>
            ((IRBuiltinFunction **)&local_38,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::CallInstr,std::default_delete<flow::CallInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_30,&local_38);
  pIVar1 = insert(this,&local_30);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_30);
  std::unique_ptr<flow::CallInstr,_std::default_delete<flow::CallInstr>_>::~unique_ptr(&local_38);
  return (CallInstr *)pIVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }